

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

int __thiscall
trieste::detail::Not::clone(Not *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<trieste::detail::Not> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  Not *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::make_shared<trieste::detail::Not,trieste::detail::Not_const&>((Not *)&local_28);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::Not,void>
            ((shared_ptr<trieste::detail::PatternDef> *)this,&local_28);
  std::shared_ptr<trieste::detail::Not>::~shared_ptr(&local_28);
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<Not>(*this);
      }